

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O3

void __thiscall ParserTestInNewline::Run(ParserTestInNewline *this)

{
  BindingEnv *this_00;
  Rule *this_01;
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  *pmVar4;
  EvalString *this_02;
  string local_70;
  string local_50;
  
  iVar3 = g_current_test->assertion_failures_;
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "rule cat_rsp\n  command = cat $in_newline > $out\n\nbuild out: cat_rsp in in2\n  rspfile=out.rsp\n"
            );
  pTVar1 = g_current_test;
  if (iVar3 == g_current_test->assertion_failures_) {
    this_00 = &(this->super_ParserTest).state.bindings_;
    pmVar4 = BindingEnv::GetRules_abi_cxx11_(this_00);
    bVar2 = testing::Test::Check
                      (pTVar1,(pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                       ,0x88,"2u == state.bindings_.GetRules().size()");
    if (bVar2) {
      pmVar4 = BindingEnv::GetRules_abi_cxx11_(this_00);
      pTVar1 = g_current_test;
      this_01 = *(Rule **)((pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left + 2);
      iVar3 = std::__cxx11::string::compare((char *)this_01);
      testing::Test::Check
                (pTVar1,iVar3 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x8a,"\"cat_rsp\" == rule->name()");
      pTVar1 = g_current_test;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"command","");
      this_02 = Rule::GetBinding(this_01,&local_50);
      EvalString::Serialize_abi_cxx11_(&local_70,this_02);
      iVar3 = std::__cxx11::string::compare((char *)&local_70);
      testing::Test::Check
                (pTVar1,iVar3 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x8c,
                 "\"[cat ][$in_newline][ > ][$out]\" == rule->GetBinding(\"command\")->Serialize()")
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pTVar1 = g_current_test;
      Edge::EvaluateCommand_abi_cxx11_
                (&local_70,
                 *(this->super_ParserTest).state.edges_.
                  super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                  super__Vector_impl_data._M_start,false);
      iVar3 = std::__cxx11::string::compare((char *)&local_70);
      testing::Test::Check
                (pTVar1,iVar3 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x8f,"\"cat in\\nin2 > out\" == edge->EvaluateCommand()");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(ParserTest, InNewline) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat_rsp\n"
"  command = cat $in_newline > $out\n"
"\n"
"build out: cat_rsp in in2\n"
"  rspfile=out.rsp\n"));

  ASSERT_EQ(2u, state.bindings_.GetRules().size());
  const Rule* rule = state.bindings_.GetRules().begin()->second;
  EXPECT_EQ("cat_rsp", rule->name());
  EXPECT_EQ("[cat ][$in_newline][ > ][$out]",
            rule->GetBinding("command")->Serialize());

  Edge* edge = state.edges_[0];
  EXPECT_EQ("cat in\nin2 > out", edge->EvaluateCommand());
}